

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemanager.c
# Opt level: O2

csafestring_t * filemanager_calculateCompilationPath(ctemplate_t *ctemplate,char *templateFile)

{
  csafestring_t *obj;
  char *pcVar1;
  
  obj = safe_clone(ctemplate->workingBaseDir);
  safe_strcat(obj,templateFile);
  pcVar1 = filemanager_getSuffix(obj->data);
  pcVar1[0] = 's';
  pcVar1[1] = 'o';
  pcVar1[2] = '\0';
  return obj;
}

Assistant:

csafestring_t *filemanager_calculateCompilationPath(ctemplate_t *ctemplate, char *templateFile) {
	csafestring_t *compilationPath = safe_clone(ctemplate->workingBaseDir);
	safe_strcat(compilationPath, templateFile);

	char *suffix = filemanager_getSuffix(compilationPath->data);
	*suffix = 's';
	*( suffix + 1 ) = 'o';
	*( suffix + 2 ) = '\0';

	return compilationPath;
}